

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O2

bool is_col_taken(vector<bool,_std::allocator<bool>_> *col_is_taken,
                 robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *col_is_taken_s,size_t col_num)

{
  iterator iVar1;
  bool bVar2;
  reference rVar3;
  size_t local_10;
  
  local_10 = col_num;
  if (((col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p ==
       (col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p) &&
     ((col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    iVar1 = tsl::detail_robin_hash::
            robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
            ::find<unsigned_long>(&col_is_taken_s->m_ht,&local_10);
    bVar2 = iVar1.m_bucket ==
            (col_is_taken_s->m_ht).m_buckets + (col_is_taken_s->m_ht).m_bucket_count;
  }
  else {
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](col_is_taken,col_num);
    bVar2 = (*rVar3._M_p & rVar3._M_mask) == 0;
  }
  return !bVar2;
}

Assistant:

bool is_col_taken(std::vector<bool> &col_is_taken, hashed_set<size_t> &col_is_taken_s,
                  size_t col_num)
{
    if (!col_is_taken.empty())
        return col_is_taken[col_num];
    else
        return col_is_taken_s.find(col_num) != col_is_taken_s.end();
}